

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeT2LoadT(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  bool bVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint64_t Address_00;
  uint64_t Address_01;
  uint Op;
  DecodeStatus DVar4;
  uint uVar5;
  
  uVar5 = Insn >> 0x10 & 0xf;
  if (uVar5 != 0xf) {
    DVar3 = DecoderGPRRegisterClass(Inst,Insn >> 0xc & 0xf,Address,Decoder);
    bVar1 = true;
    if ((DVar3 != MCDisassembler_Success) && (DVar3 != MCDisassembler_SoftFail)) {
      if (DVar3 != MCDisassembler_Fail) {
        DVar3 = MCDisassembler_Success;
      }
      bVar1 = false;
    }
    if ((!bVar1) ||
       (((DVar2 = DecodeT2AddrModeImm8(Inst,uVar5 << 9 | Insn & 0xff,Address_00,Decoder),
         DVar4 = DVar2, DVar2 != MCDisassembler_Fail &&
         (DVar4 = DVar3, DVar2 != MCDisassembler_Success)) &&
        (DVar4 = DVar2, DVar2 != MCDisassembler_SoftFail)))) {
      DVar4 = MCDisassembler_Fail;
    }
    return DVar4;
  }
  uVar5 = MCInst_getOpcode(Inst);
  if ((int)uVar5 < 0x961) {
    if (uVar5 == 0x94a) {
      Op = 0x94f;
    }
    else {
      if (uVar5 != 0x959) {
        return MCDisassembler_Fail;
      }
      Op = 0x95e;
    }
  }
  else if (uVar5 == 0x961) {
    Op = 0x966;
  }
  else if (uVar5 == 0x969) {
    Op = 0x96e;
  }
  else {
    Op = 0x976;
    if (uVar5 != 0x971) {
      return MCDisassembler_Fail;
    }
  }
  MCInst_setOpcode(Inst,Op);
  DVar3 = DecodeT2LoadLabel(Inst,Insn,Address_01,Decoder);
  return DVar3;
}

Assistant:

static DecodeStatus DecodeT2LoadT(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	imm |= (Rn << 9);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRT:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRBT:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRHT:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSBT:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRSHT:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (!Check(&S, DecoderGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeT2AddrModeImm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}